

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_realm_spell_noun(parser *p)

{
  char *pcVar1;
  void *pvVar2;
  magic_realm *realm;
  char *spell;
  parser *p_local;
  
  pcVar1 = parser_getstr(p,"spell");
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    string_free(*(char **)((long)pvVar2 + 0x28));
    pcVar1 = string_make(pcVar1);
    *(char **)((long)pvVar2 + 0x28) = pcVar1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_realm_spell_noun(struct parser *p) {
	const char *spell = parser_getstr(p, "spell");
	struct magic_realm *realm = parser_priv(p);

	if (!realm) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	string_free(realm->spell_noun);
	realm->spell_noun = string_make(spell);
	return PARSE_ERROR_NONE;
}